

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::setLayoutDirection_helper(QWidgetPrivate *this,LayoutDirection direction)

{
  QWidget *this_00;
  long lVar1;
  QWidgetPrivate *this_01;
  ulong uVar2;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if ((direction == RightToLeft) != (bool)(*(byte *)(*(long *)&this_00->field_0x8 + 0x243) & 1)) {
    QWidget::setAttribute(this_00,WA_RightToLeft,direction == RightToLeft);
    uVar2 = *(ulong *)&this->field_0x28;
    if (uVar2 != 0) {
      for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
        lVar1 = *(long *)(*(long *)&this->field_0x20 + uVar3 * 8);
        if ((((lVar1 != 0) &&
             (this_01 = *(QWidgetPrivate **)(lVar1 + 8), (this_01->field_0x30 & 1) != 0)) &&
            ((*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) == 0)) &&
           ((this_01->high_attributes[0] & 0x2000000) == 0)) {
          setLayoutDirection_helper(this_01,direction);
          uVar2 = *(ulong *)&this->field_0x28;
        }
      }
    }
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,LayoutDirectionChange);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setLayoutDirection_helper(Qt::LayoutDirection direction)
{
    Q_Q(QWidget);

    if ( (direction == Qt::RightToLeft) == q->testAttribute(Qt::WA_RightToLeft))
        return;
    q->setAttribute(Qt::WA_RightToLeft, (direction == Qt::RightToLeft));
    if (!children.isEmpty()) {
        for (int i = 0; i < children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget*>(children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_SetLayoutDirection))
                w->d_func()->setLayoutDirection_helper(direction);
        }
    }
    QEvent e(QEvent::LayoutDirectionChange);
    QCoreApplication::sendEvent(q, &e);
}